

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::AssertSnapEquiv
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  char16_t *string1;
  char16_t *string2;
  SnapHandler *pSVar1;
  TTDVar v1;
  TTDVar v2;
  int64 iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int64 iVar6;
  uint uVar7;
  ulong uVar8;
  uint depth;
  SnapObject *pSVar9;
  bool bVar10;
  int64 local_a0;
  int64 locationTag;
  BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  sobj1PidMap;
  int local_54;
  SnapObject *local_50;
  SnapObject *local_48;
  TTDCompareMap *local_40;
  SnapHandlerPropertyEntry local_38;
  SnapHandlerPropertyEntry spe;
  
  TTDCompareMap::DiagnosticAssert(compareMap,sobj1->SnapObjectTag == sobj2->SnapObjectTag);
  string1 = sobj1->OptWellKnownToken;
  string2 = sobj2->OptWellKnownToken;
  if (string1 == string2) {
    bVar10 = true;
  }
  else if (string2 == (char16_t *)0x0 || string1 == (char16_t *)0x0) {
    bVar10 = false;
  }
  else {
    iVar4 = PAL_wcscmp(string1,string2);
    bVar10 = iVar4 == 0;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar10);
  NSSnapType::AssertSnapEquiv(sobj1->SnapType,sobj2->SnapType,compareMap);
  if ((sobj1->OptDependsOnInfo == (DependsOnInfo *)0x0) &&
     (sobj2->OptDependsOnInfo == (DependsOnInfo *)0x0)) {
    bVar10 = true;
  }
  else {
    bVar10 = sobj1->OptDependsOnInfo->DepOnCount == sobj2->OptDependsOnInfo->DepOnCount;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar10);
  if (compareMap->StrictCrossSite == true) {
    bVar10 = sobj1->IsCrossSite == sobj2->IsCrossSite;
  }
  else if (sobj1->IsCrossSite == 0) {
    bVar10 = true;
  }
  else {
    bVar10 = sobj2->IsCrossSite != 0;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar10);
  bVar10 = Js::DynamicType::Is(sobj1->SnapType->JsTypeId);
  local_50 = sobj1;
  bVar3 = Js::DynamicType::Is(sobj2->SnapType->JsTypeId);
  pSVar9 = local_50;
  TTDCompareMap::DiagnosticAssert(compareMap,bVar3 == bVar10);
  bVar10 = Js::DynamicType::Is(pSVar9->SnapType->JsTypeId);
  if (bVar10) {
    local_48 = sobj2;
    local_40 = compareMap;
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
              (compareMap,pSVar9->OptIndexedObjectArray,sobj2->OptIndexedObjectArray,
               L"indexedObjectArray");
    pSVar1 = pSVar9->SnapType->TypeHandlerInfo;
    locationTag = 0;
    sobj1PidMap.buckets = (Type)0x0;
    sobj1PidMap.entries = (Type)&Memory::HeapAllocator::Instance;
    sobj1PidMap.alloc = (Type)0x0;
    sobj1PidMap.size = 0;
    sobj1PidMap.count = 0;
    sobj1PidMap.freeList = 0x4b;
    sobj1PidMap.freeCount = 0;
    sobj1PidMap.modFunctionIndex = 0;
    if (pSVar1->MaxPropertyIndex != 0) {
      uVar8 = 0;
      do {
        local_38 = pSVar1->PropertyInfoArray[uVar8];
        if (local_38.DataKind != Clear) {
          local_a0 = NSSnapType::ComputeLocationTagForAssertCompare(&local_38);
          local_54 = (int)uVar8;
          JsUtil::
          BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&locationTag,&local_a0,&local_54);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < pSVar1->MaxPropertyIndex);
    }
    pSVar1 = local_48->SnapType->TypeHandlerInfo;
    if (pSVar1->MaxPropertyIndex != 0) {
      uVar8 = 0;
      do {
        local_38 = pSVar1->PropertyInfoArray[uVar8];
        if (Uninitialized < local_38.DataKind) {
          iVar6 = NSSnapType::ComputeLocationTagForAssertCompare(&local_38);
          iVar2 = locationTag;
          depth = 0;
          if (locationTag != 0) {
            uVar5 = JsUtil::
                    BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::GetBucket((int)iVar6 * 2 + 1,sobj1PidMap.alloc._4_4_,sobj1PidMap.freeList);
            uVar7 = *(uint *)(iVar2 + (ulong)uVar5 * 4);
            if (-1 < (int)uVar7) {
              depth = 0;
              do {
                if (*(long *)(sobj1PidMap.buckets + (ulong)uVar7 * 4 + 2) == iVar6) {
                  if (sobj1PidMap._40_8_ != 0) {
                    DictionaryStats::Lookup((DictionaryStats *)sobj1PidMap._40_8_,depth);
                  }
                  goto LAB_0091b287;
                }
                depth = depth + 1;
                uVar7 = sobj1PidMap.buckets[(ulong)uVar7 * 4 + 1];
              } while (-1 < (int)uVar7);
            }
          }
          uVar7 = 0xffffffff;
          if (sobj1PidMap._40_8_ != 0) {
            DictionaryStats::Lookup((DictionaryStats *)sobj1PidMap._40_8_,depth);
          }
LAB_0091b287:
          if ((int)uVar7 < 0) {
            iVar4 = -1;
          }
          else {
            iVar4 = sobj1PidMap.buckets[(ulong)uVar7 * 4];
          }
          TTDCompareMap::DiagnosticAssert(local_40,iVar4 != -1);
          v1 = local_50->VarArray[iVar4];
          v2 = local_48->VarArray[uVar8];
          if (local_38.DataKind == Setter) {
            NSSnapValues::AssertSnapEquivTTDVar_PropertySetter
                      (v1,v2,local_40,local_38.PropertyRecordId);
          }
          else if (local_38.DataKind == Getter) {
            NSSnapValues::AssertSnapEquivTTDVar_PropertyGetter
                      (v1,v2,local_40,local_38.PropertyRecordId);
          }
          else {
            if (local_38.DataKind != Data) {
              TTDAbort_unrecoverable_error("What other tags are there???");
            }
            NSSnapValues::AssertSnapEquivTTDVar_Property(v1,v2,local_40,local_38.PropertyRecordId);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < pSVar1->MaxPropertyIndex);
    }
    JsUtil::
    BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)&locationTag);
    compareMap = local_40;
    pSVar9 = local_50;
    sobj2 = local_48;
  }
  if (compareMap->SnapObjCmpVTable[(int)pSVar9->SnapObjectTag] != (fPtr_AssertSnapEquivAddtlInfo)0x0
     ) {
    (*compareMap->SnapObjCmpVTable[(int)pSVar9->SnapObjectTag])(pSVar9,sobj2,compareMap);
  }
  return;
}

Assistant:

void AssertSnapEquiv(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(sobj1->SnapObjectTag == sobj2->SnapObjectTag);
            compareMap.DiagnosticAssert(TTD_DIAGNOSTIC_COMPARE_WELLKNOWN_TOKENS(sobj1->OptWellKnownToken, sobj2->OptWellKnownToken));

            NSSnapType::AssertSnapEquiv(sobj1->SnapType, sobj2->SnapType, compareMap);

            //Depends on info is a function of the rest of the properties so we don't need to explicitly check it.
            //But for sanity assert same counts.
            compareMap.DiagnosticAssert((sobj1->OptDependsOnInfo == nullptr && sobj2->OptDependsOnInfo == nullptr) || (sobj1->OptDependsOnInfo->DepOnCount == sobj2->OptDependsOnInfo->DepOnCount));

            //we allow the replay in debug mode to be cross site even if orig was not (that is ok) but if record was x-site then replay must be as well
            if(compareMap.StrictCrossSite)
            {
                compareMap.DiagnosticAssert(sobj1->IsCrossSite == sobj2->IsCrossSite);
            }
            else
            {
                compareMap.DiagnosticAssert(!sobj1->IsCrossSite || sobj2->IsCrossSite);
            }

#if ENABLE_OBJECT_SOURCE_TRACKING
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.SourceLine == sobj2->DiagOriginInfo.SourceLine);
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.EventTime == sobj2->DiagOriginInfo.EventTime);
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.TimeHash == sobj2->DiagOriginInfo.TimeHash);
#endif

            compareMap.DiagnosticAssert(Js::DynamicType::Is(sobj1->SnapType->JsTypeId) == Js::DynamicType::Is(sobj2->SnapType->JsTypeId));
            if(Js::DynamicType::Is(sobj1->SnapType->JsTypeId))
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_Special(sobj1->OptIndexedObjectArray, sobj2->OptIndexedObjectArray, _u("indexedObjectArray"));

                const NSSnapType::SnapHandler* handler1 = sobj1->SnapType->TypeHandlerInfo;
                JsUtil::BaseDictionary<int64, int32, HeapAllocator> sobj1PidMap(&HeapAllocator::Instance);
                for(uint32 i = 0; i < handler1->MaxPropertyIndex; ++i)
                {
                    const NSSnapType::SnapHandlerPropertyEntry spe = handler1->PropertyInfoArray[i];
                    if(spe.DataKind != NSSnapType::SnapEntryDataKindTag::Clear)
                    {
                        int64 locationTag = ComputeLocationTagForAssertCompare(spe);
                        sobj1PidMap.AddNew(locationTag, (int32)i);
                    }
                }

                const NSSnapType::SnapHandler* handler2 = sobj2->SnapType->TypeHandlerInfo;
                for(uint32 i = 0; i < handler2->MaxPropertyIndex; ++i)
                {
                    const NSSnapType::SnapHandlerPropertyEntry spe = handler2->PropertyInfoArray[i];
                    if(spe.DataKind != NSSnapType::SnapEntryDataKindTag::Clear && spe.DataKind != NSSnapType::SnapEntryDataKindTag::Uninitialized)
                    {
                        int64 locationTag = ComputeLocationTagForAssertCompare(spe);

                        int32 idx1 = sobj1PidMap.LookupWithKey(locationTag, -1);
                        compareMap.DiagnosticAssert(idx1 != -1);

                        TTDVar var1 = sobj1->VarArray[idx1];
                        TTDVar var2 = sobj2->VarArray[i];

                        if(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Data)
                        {
                            NSSnapValues::AssertSnapEquivTTDVar_Property(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                        else if(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Getter)
                        {
                            NSSnapValues::AssertSnapEquivTTDVar_PropertyGetter(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                        else
                        {
                            TTDAssert(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Setter, "What other tags are there???");

                            NSSnapValues::AssertSnapEquivTTDVar_PropertySetter(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                    }
                }
            }

            fPtr_AssertSnapEquivAddtlInfo equivCheck = compareMap.SnapObjCmpVTable[(int32)sobj1->SnapObjectTag];
            if(equivCheck != nullptr)
            {
                equivCheck(sobj1, sobj2, compareMap);
            }
        }